

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

bool __thiscall roaring::Roaring64Map::operator==(Roaring64Map *this,Roaring64Map *r)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  bool bVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  _Rb_tree_header *p_Var7;
  
  p_Var4 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (r->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(r->roarings)._M_t._M_impl.super__Rb_tree_header;
  do {
    while( true ) {
      if (((_Rb_tree_header *)p_Var4 == p_Var7) || ((_Rb_tree_header *)p_Var5 == p_Var6)) {
        while( true ) {
          if ((_Rb_tree_header *)p_Var4 == p_Var7) {
            while (((_Rb_tree_header *)p_Var5 != p_Var6 &&
                   (bVar3 = Roaring::isEmpty((Roaring *)&p_Var5[1]._M_parent), bVar3))) {
              p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
            }
            return (_Rb_tree_header *)p_Var5 == p_Var6;
          }
          bVar3 = Roaring::isEmpty((Roaring *)&p_Var4[1]._M_parent);
          if (!bVar3) break;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        }
        return false;
      }
      _Var1 = p_Var4[1]._M_color;
      _Var2 = p_Var5[1]._M_color;
      bVar3 = Roaring::isEmpty((Roaring *)&p_Var4[1]._M_parent);
      if (!bVar3) break;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    }
    bVar3 = Roaring::isEmpty((Roaring *)&p_Var5[1]._M_parent);
    if (!bVar3) {
      if (_Var1 != _Var2) {
        return false;
      }
      bVar3 = Roaring::operator==((Roaring *)&p_Var4[1]._M_parent,(Roaring *)&p_Var5[1]._M_parent);
      if (!bVar3) {
        return false;
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

bool operator==(const Roaring64Map &r) const {
        // we cannot use operator == on the map because either side may contain
        // empty Roaring Bitmaps
        auto lhs_iter = roarings.cbegin();
        auto lhs_cend = roarings.cend();
        auto rhs_iter = r.roarings.cbegin();
        auto rhs_cend = r.roarings.cend();
        while (lhs_iter != lhs_cend && rhs_iter != rhs_cend) {
            auto lhs_key = lhs_iter->first, rhs_key = rhs_iter->first;
            const auto &lhs_map = lhs_iter->second, &rhs_map = rhs_iter->second;
            if (lhs_map.isEmpty()) {
                ++lhs_iter;
                continue;
            }
            if (rhs_map.isEmpty()) {
                ++rhs_iter;
                continue;
            }
            if (!(lhs_key == rhs_key)) {
                return false;
            }
            if (!(lhs_map == rhs_map)) {
                return false;
            }
            ++lhs_iter;
            ++rhs_iter;
        }
        while (lhs_iter != lhs_cend) {
            if (!lhs_iter->second.isEmpty()) {
                return false;
            }
            ++lhs_iter;
        }
        while (rhs_iter != rhs_cend) {
            if (!rhs_iter->second.isEmpty()) {
                return false;
            }
            ++rhs_iter;
        }
        return true;
    }